

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

uint __thiscall
ON_OutlineFigure::GetFigureCurves
          (ON_OutlineFigure *this,double scale,bool b3d,
          ON_SimpleArray<ON_NurbsCurve_*> *figure_curves)

{
  bool bVar1;
  ON__UINT32 OVar2;
  undefined7 extraout_var;
  uint figure_end_dex;
  uint uVar3;
  ON__UINT32 i;
  ON_NurbsCurve *figures_segment;
  ON__UINT32 local_5c;
  double local_58;
  undefined8 local_50;
  int local_44;
  double local_40;
  ON_NurbsCurve *local_38;
  
  uVar3 = 0;
  local_58 = scale;
  bVar1 = Internal_HasValidEnds(this,false);
  if (bVar1) {
    local_44 = figure_curves->m_count;
    bVar1 = ON_IsValid(local_58);
    local_40 = 1.0;
    if ((local_58 <= 0.0 || !bVar1) || (ABS(local_58 + -1.0) <= 1e-05)) {
      local_50 = 0;
    }
    else {
      local_50 = CONCAT71(extraout_var,1);
      local_40 = local_58;
    }
    figure_end_dex = (this->m_points).m_count - 1;
    OVar2 = Internal_EstimateFigureSegmentCount(this);
    ON_SimpleArray<ON_NurbsCurve_*>::Reserve(figure_curves,(ulong)OVar2);
    uVar3 = 0;
    while (uVar3 < figure_end_dex) {
      local_5c = 0;
      local_38 = Internal_GetFigureCurve
                           (this,figure_end_dex,uVar3,&local_5c,b3d,(ON_NurbsCurve *)0x0);
      if (local_5c <= uVar3) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0x55a,"","Failed to parse a figure segment.");
        break;
      }
      uVar3 = local_5c;
      if (local_38 != (ON_NurbsCurve *)0x0) {
        if ((char)local_50 != '\0') {
          ON_Geometry::Scale((ON_Geometry *)local_38,local_40);
        }
        ON_SimpleArray<ON_NurbsCurve_*>::Append(figure_curves,&local_38);
      }
    }
    uVar3 = figure_curves->m_count - local_44;
  }
  return uVar3;
}

Assistant:

unsigned int ON_OutlineFigure::GetFigureCurves(
  double scale,
  bool b3d,
  ON_SimpleArray< ON_NurbsCurve* >& figure_curves
) const
{
  if (false == Internal_HasValidEnds(false))
    return 0;

  const unsigned int figure_curves_count0 = figure_curves.UnsignedCount();

  const bool bApplyScale = ON_IsValid(scale) && scale > 0.0 && fabs(scale - 1.0) > 1.0e-5;
  if (false == bApplyScale)
    scale = 1.0;

  const ON__UINT32 figure_start_dex = 0;
  const ON__UINT32 figure_end_dex = m_points.UnsignedCount() - 1;

  //const ON_OutlineFigurePoint figure_start = m_points[figure_start_dex];
  //const ON_OutlineFigurePoint figure_end = m_points[figure_end_dex];
    
  // Find the end of this figure curve and estimate its NURBS curve segment_count.
  //bool bClosedFigure
  //  = ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type
  //  && figure_end.IsOnFigure()
  //  && figure_start.m_point == figure_end.m_point
  //  ;

  // estimate number of NURBS curve segments
  figure_curves.Reserve(Internal_EstimateFigureSegmentCount());

  // get NURBS curve segments
  ON__UINT32 segment_start_dex = figure_start_dex;
  while (segment_start_dex < figure_end_dex)
  {
    ON__UINT32 i = 0;
    ON_NurbsCurve* figures_segment = Internal_GetFigureCurve(
      figure_end_dex,
      segment_start_dex,
      &i,
      b3d,
      nullptr
    );

    if (i <= segment_start_dex)
    {
      ON_ERROR("Failed to parse a figure segment.");
      //bClosedFigure = false;
      break;
    }

    if (nullptr != figures_segment)
    {
      if (bApplyScale)
        figures_segment->Scale(scale);
      figure_curves.Append(figures_segment);
    }
    //else
    //{
    //  bClosedFigure = false;
    //}

    segment_start_dex = i;
  }

  return (figure_curves.UnsignedCount() - figure_curves_count0);
}